

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

void __thiscall pbrt::DisneyMaterial::readFrom(DisneyMaterial *this,BinaryReader *binary)

{
  size_t sVar1;
  pointer puVar2;
  size_t sVar3;
  undefined8 uVar4;
  runtime_error *this_00;
  
  Material::readFrom(&this->super_Material,binary);
  puVar2 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) <
      binary->currentEntityOffset + 4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    this->anisotropic = *(float *)(puVar2 + binary->currentEntityOffset);
    sVar3 = binary->currentEntityOffset;
    sVar1 = sVar3 + 4;
    binary->currentEntityOffset = sVar1;
    puVar2 = (binary->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(binary->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2) < sVar3 + 8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
    else {
      this->clearCoat = *(float *)(puVar2 + sVar1);
      sVar3 = binary->currentEntityOffset;
      sVar1 = sVar3 + 4;
      binary->currentEntityOffset = sVar1;
      puVar2 = (binary->currentEntityData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(binary->currentEntityData).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2) < sVar3 + 8) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"invalid read attempt by entity - not enough data in data block!");
      }
      else {
        this->clearCoatGloss = *(float *)(puVar2 + sVar1);
        sVar1 = binary->currentEntityOffset;
        binary->currentEntityOffset = sVar1 + 4;
        puVar2 = (binary->currentEntityData).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(binary->currentEntityData).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + 0x10) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,"invalid read attempt by entity - not enough data in data block!");
        }
        else {
          (this->color).z = *(float *)(puVar2 + sVar1 + 0xc);
          uVar4 = *(undefined8 *)(puVar2 + sVar1 + 4);
          (this->color).x = (float)(int)uVar4;
          (this->color).y = (float)(int)((ulong)uVar4 >> 0x20);
          sVar3 = binary->currentEntityOffset;
          sVar1 = sVar3 + 0xc;
          binary->currentEntityOffset = sVar1;
          puVar2 = (binary->currentEntityData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(binary->currentEntityData).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) < sVar3 + 0x10
             ) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_00,"invalid read attempt by entity - not enough data in data block!");
          }
          else {
            this->diffTrans = *(float *)(puVar2 + sVar1);
            sVar3 = binary->currentEntityOffset;
            sVar1 = sVar3 + 4;
            binary->currentEntityOffset = sVar1;
            puVar2 = (binary->currentEntityData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(binary->currentEntityData).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) < sVar3 + 8)
            {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"invalid read attempt by entity - not enough data in data block!");
            }
            else {
              this->eta = *(float *)(puVar2 + sVar1);
              sVar3 = binary->currentEntityOffset;
              sVar1 = sVar3 + 4;
              binary->currentEntityOffset = sVar1;
              puVar2 = (binary->currentEntityData).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(binary->currentEntityData).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <
                  sVar3 + 8) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (this_00,"invalid read attempt by entity - not enough data in data block!"
                          );
              }
              else {
                this->flatness = *(float *)(puVar2 + sVar1);
                sVar3 = binary->currentEntityOffset;
                sVar1 = sVar3 + 4;
                binary->currentEntityOffset = sVar1;
                puVar2 = (binary->currentEntityData).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(binary->currentEntityData).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <
                    sVar3 + 8) {
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (this_00,
                             "invalid read attempt by entity - not enough data in data block!");
                }
                else {
                  this->metallic = *(float *)(puVar2 + sVar1);
                  sVar3 = binary->currentEntityOffset;
                  sVar1 = sVar3 + 4;
                  binary->currentEntityOffset = sVar1;
                  puVar2 = (binary->currentEntityData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  if ((ulong)((long)(binary->currentEntityData).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <
                      sVar3 + 8) {
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error
                              (this_00,
                               "invalid read attempt by entity - not enough data in data block!");
                  }
                  else {
                    this->roughness = *(float *)(puVar2 + sVar1);
                    sVar3 = binary->currentEntityOffset;
                    sVar1 = sVar3 + 4;
                    binary->currentEntityOffset = sVar1;
                    puVar2 = (binary->currentEntityData).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    if ((ulong)((long)(binary->currentEntityData).
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <
                        sVar3 + 8) {
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                (this_00,
                                 "invalid read attempt by entity - not enough data in data block!");
                    }
                    else {
                      this->sheen = *(float *)(puVar2 + sVar1);
                      sVar3 = binary->currentEntityOffset;
                      sVar1 = sVar3 + 4;
                      binary->currentEntityOffset = sVar1;
                      puVar2 = (binary->currentEntityData).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      if ((ulong)((long)(binary->currentEntityData).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <
                          sVar3 + 8) {
                        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  (this_00,
                                   "invalid read attempt by entity - not enough data in data block!"
                                  );
                      }
                      else {
                        this->sheenTint = *(float *)(puVar2 + sVar1);
                        sVar3 = binary->currentEntityOffset;
                        sVar1 = sVar3 + 4;
                        binary->currentEntityOffset = sVar1;
                        puVar2 = (binary->currentEntityData).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                        if ((ulong)((long)(binary->currentEntityData).
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2)
                            < sVar3 + 8) {
                          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (this_00,
                                     "invalid read attempt by entity - not enough data in data block!"
                                    );
                        }
                        else {
                          this->specTrans = *(float *)(puVar2 + sVar1);
                          sVar3 = binary->currentEntityOffset;
                          sVar1 = sVar3 + 4;
                          binary->currentEntityOffset = sVar1;
                          puVar2 = (binary->currentEntityData).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          if ((ulong)((long)(binary->currentEntityData).
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)puVar2) < sVar3 + 8) {
                            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (this_00,
                                       "invalid read attempt by entity - not enough data in data block!"
                                      );
                          }
                          else {
                            this->specularTint = *(float *)(puVar2 + sVar1);
                            sVar3 = binary->currentEntityOffset;
                            sVar1 = sVar3 + 4;
                            binary->currentEntityOffset = sVar1;
                            puVar2 = (binary->currentEntityData).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            if (sVar3 + 5 <=
                                (ulong)((long)(binary->currentEntityData).
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)puVar2)) {
                              this->thin = (bool)puVar2[sVar1];
                              binary->currentEntityOffset = binary->currentEntityOffset + 1;
                              return;
                            }
                            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (this_00,
                                       "invalid read attempt by entity - not enough data in data block!"
                                      );
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DisneyMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(anisotropic);
    binary.read(clearCoat);
    binary.read(clearCoatGloss);
    binary.read(color);
    binary.read(diffTrans);
    binary.read(eta);
    binary.read(flatness);
    binary.read(metallic);
    binary.read(roughness);
    binary.read(sheen);
    binary.read(sheenTint);
    binary.read(specTrans);
    binary.read(specularTint);
    binary.read(thin);
  }